

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::message::~message(message *this)

{
  *(undefined ***)this = &PTR__message_0019eae0;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~message() throw() {}